

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

BBox3fa * __thiscall
embree::SceneGraph::HairSetNode::bounds(BBox3fa *__return_storage_ptr__,HairSetNode *this)

{
  undefined1 auVar1 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *p;
  pointer pvVar3;
  BBox3fa *b;
  long lVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  
  aVar5 = _DAT_0024eb70;
  (__return_storage_ptr__->lower).field_0 = _DAT_0024eb70;
  aVar2 = _DAT_0024eb80;
  (__return_storage_ptr__->upper).field_0 = _DAT_0024eb80;
  aVar6 = _DAT_0024eb80;
  for (pvVar3 = (this->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 != (this->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pvVar3 = pvVar3 + 1) {
    if (pvVar3->size_active != 0) {
      lVar4 = 0;
      do {
        auVar1 = *(undefined1 (*) [16])((long)&pvVar3->items->field_0 + lVar4);
        aVar5.m128 = (__m128)minps(aVar5.m128,auVar1);
        aVar6.m128 = (__m128)maxps(aVar6.m128,auVar1);
        lVar4 = lVar4 + 0x10;
      } while (pvVar3->size_active << 4 != lVar4);
    }
    aVar2 = aVar6;
  }
  (__return_storage_ptr__->lower).field_0 = aVar5;
  (__return_storage_ptr__->upper).field_0 = aVar2;
  return __return_storage_ptr__;
}

Assistant:

virtual BBox3fa bounds() const
      {
        BBox3fa b = empty;
        for (const auto& p : positions)
          for (auto& x : p)
            b.extend(x);
        return b;
      }